

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharmmTorsionType.cpp
# Opt level: O0

void __thiscall
OpenMD::CharmmTorsionType::CharmmTorsionType
          (CharmmTorsionType *this,
          vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
          *parameters)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  DoublePolynomial *this_00;
  pointer pCVar4;
  TorsionType *in_RDI;
  PolynomialType *p;
  DoublePolynomial sinTerm;
  DoublePolynomial cosTerm;
  ChebyshevU U;
  ChebyshevT T;
  int maxPower;
  iterator i;
  Polynomial<double> *in_stack_fffffffffffffe98;
  ChebyshevT *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb8;
  int maxPower_00;
  ChebyshevT *in_stack_fffffffffffffec0;
  Polynomial<double> *this_01;
  __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
  local_28;
  
  maxPower_00 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  in_RDI->_vptr_TorsionType = (_func_int **)0x0;
  TorsionType::TorsionType(in_RDI);
  in_RDI->_vptr_TorsionType = (_func_int **)&PTR__CharmmTorsionType_0046cab8;
  this_01 = (Polynomial<double> *)(in_RDI + 1);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x386e7d);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x386e92);
  in_RDI[0xd]._vptr_TorsionType = (_func_int **)0x0;
  __gnu_cxx::
  __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
  ::__normal_iterator(&stack0xffffffffffffffd8);
  iVar2 = std::
          vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
          begin((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                 *)in_stack_fffffffffffffe98);
  iVar3 = std::
          vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
          end((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
               *)in_stack_fffffffffffffe98);
  local_28 = std::
             max_element<__gnu_cxx::__normal_iterator<OpenMD::CharmmTorsionParameter*,std::vector<OpenMD::CharmmTorsionParameter,std::allocator<OpenMD::CharmmTorsionParameter>>>,OpenMD::LessThanPeriodicityFunctor>
                       (iVar2._M_current,iVar3._M_current);
  std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::end
            ((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
              *)in_stack_fffffffffffffe98);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                      *)in_stack_fffffffffffffea0,
                     (__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                      *)in_stack_fffffffffffffe98);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
    ::operator->(&stack0xffffffffffffffd8);
    ChebyshevT::ChebyshevT(in_stack_fffffffffffffec0,maxPower_00);
    ChebyshevU::ChebyshevU((ChebyshevU *)in_stack_fffffffffffffec0,maxPower_00);
    local_28._M_current =
         (CharmmTorsionParameter *)
         std::
         vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
         begin((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                *)in_stack_fffffffffffffe98);
    while( true ) {
      std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
      end((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_> *
          )in_stack_fffffffffffffe98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
      ::operator->(&stack0xffffffffffffffd8);
      this_00 = ChebyshevT::getChebyshevPolynomial
                          (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                          );
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      pCVar4 = __gnu_cxx::
               __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      p = (PolynomialType *)cos(pCVar4->delta);
      __gnu_cxx::
      __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
      ::operator->(&stack0xffffffffffffffd8);
      Polynomial<double>::operator*=(this_01,(double)in_RDI);
      __gnu_cxx::
      __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
      ::operator->(&stack0xffffffffffffffd8);
      ChebyshevU::getChebyshevPolynomial
                ((ChebyshevU *)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_stack_fffffffffffffe98 = (Polynomial<double> *)&stack0xffffffffffffffd8;
      pCVar4 = __gnu_cxx::
               __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
               ::operator->((__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                             *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffea0 = (ChebyshevT *)sin(pCVar4->delta);
      __gnu_cxx::
      __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
      ::operator->((__normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
                    *)in_stack_fffffffffffffe98);
      Polynomial<double>::operator*=(this_01,(double)in_RDI);
      Polynomial<double>::operator+=(this_00,p);
      Polynomial<double>::operator+=(this_00,p);
      pCVar4 = __gnu_cxx::
               __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      in_RDI[0xd]._vptr_TorsionType =
           (_func_int **)(pCVar4->kchi + (double)in_RDI[0xd]._vptr_TorsionType);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x387140);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x38714d);
      __gnu_cxx::
      __normal_iterator<OpenMD::CharmmTorsionParameter_*,_std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>_>
      ::operator++(&stack0xffffffffffffffd8);
    }
    ChebyshevU::~ChebyshevU((ChebyshevU *)0x387229);
    ChebyshevT::~ChebyshevT((ChebyshevT *)0x387236);
  }
  return;
}

Assistant:

CharmmTorsionType::CharmmTorsionType(
      std::vector<CharmmTorsionParameter>& parameters) :
      TorsionType(),
      C_(0.0) {
    std::vector<CharmmTorsionParameter>::iterator i;
    i = std::max_element(parameters.begin(), parameters.end(),
                         LessThanPeriodicityFunctor());
    if (i != parameters.end()) {
      int maxPower = i->n;
      ChebyshevT T(maxPower);
      ChebyshevU U(maxPower);

      // convert parameters of charmm type torsion into
      // Polynomial parameters

      for (i = parameters.begin(); i != parameters.end(); ++i) {
        DoublePolynomial cosTerm = T.getChebyshevPolynomial(i->n);
        cosTerm *= (cos(i->delta) * i->kchi);

        // should check that i->n is >= 1
        DoublePolynomial sinTerm = U.getChebyshevPolynomial(i->n - 1);
        sinTerm *= -(sin(i->delta) * i->kchi);

        T_ += cosTerm;
        U_ += sinTerm;
        C_ += i->kchi;
      }
    }
  }